

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O3

void Parser_skipWhiteSpaces(Parser *xmlParser)

{
  char cVar1;
  void *pvVar2;
  char *pcVar3;
  
  pcVar3 = xmlParser->curPtr;
  cVar1 = *pcVar3;
  while ((cVar1 != '\0' && (pvVar2 = memchr("\n\t\r ",(int)cVar1,5), pvVar2 != (void *)0x0))) {
    cVar1 = pcVar3[1];
    pcVar3 = pcVar3 + 1;
  }
  xmlParser->curPtr = pcVar3;
  return;
}

Assistant:

static void Parser_skipWhiteSpaces(
	/*! [in] The XML parser. */
	Parser *xmlParser)
{
	char *p = xmlParser->curPtr;
	while (*p && strchr(WHITESPACE, *p)) {
		++p;
	}
	xmlParser->curPtr = p;
}